

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

bool __thiscall
spvtools::val::Function::CheckLimitations
          (Function *this,ValidationState_t *_,Function *entry_point,string *reason)

{
  bool bVar1;
  ostream *poVar2;
  bool bVar3;
  _List_node_base *p_Var4;
  string message;
  stringstream ss_reason;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar3 = true;
  p_Var4 = (_List_node_base *)&this->limitations_;
  do {
    p_Var4 = (((_List_base<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&this->limitations_) {
      if (reason == (string *)0x0 || bVar3 != false) goto LAB_0018c1ba;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)reason,(string *)&local_1d8);
      std::__cxx11::string::_M_dispose();
      break;
    }
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    bVar1 = std::
            function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
            ::operator()((function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)(p_Var4 + 1),_,entry_point,&local_1d8);
    if (reason != (string *)0x0 && !bVar1) {
      bVar1 = true;
      if (local_1d8._M_string_length != 0) {
        poVar2 = std::operator<<(local_1a8,(string *)&local_1d8);
        std::operator<<(poVar2,"\n");
      }
      bVar3 = false;
    }
    std::__cxx11::string::_M_dispose();
  } while (bVar1 != false);
  bVar3 = false;
LAB_0018c1ba:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return bVar3;
}

Assistant:

bool Function::CheckLimitations(const ValidationState_t& _,
                                const Function* entry_point,
                                std::string* reason) const {
  bool return_value = true;
  std::stringstream ss_reason;

  for (const auto& is_compatible : limitations_) {
    std::string message;
    if (!is_compatible(_, entry_point, &message)) {
      if (!reason) return false;
      return_value = false;
      if (!message.empty()) {
        ss_reason << message << "\n";
      }
    }
  }

  if (!return_value && reason) {
    *reason = ss_reason.str();
  }

  return return_value;
}